

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamReaderPrivate::Rewind(BamReaderPrivate *this)

{
  bool bVar1;
  string message;
  string currentError;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  BamRandomAccessController::ClearRegion(&this->m_randomAccessController);
  bVar1 = Seek(this,&this->m_alignmentsBeginOffset);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_30,(string *)&this->m_errorString);
    std::__cxx11::string::string((string *)&local_70,"could not rewind: \n\t",&local_71);
    std::operator+(&local_50,&local_70,&local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_70,"BamReader::Rewind",&local_71);
    SetErrorString(this,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool BamReaderPrivate::Rewind()
{

    // reset region
    m_randomAccessController.ClearRegion();

    // return status of seeking back to first alignment
    if (Seek(m_alignmentsBeginOffset)) {
        return true;
    } else {
        const std::string currentError = m_errorString;
        const std::string message = std::string("could not rewind: \n\t") + currentError;
        SetErrorString("BamReader::Rewind", message);
        return false;
    }
}